

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

PatchList re2::PatchList::Deref(Inst *inst0,PatchList l)

{
  Inst *this;
  uint in_ESI;
  long in_RDI;
  Inst *ip;
  undefined4 local_8;
  
  this = (Inst *)(in_RDI + (ulong)(in_ESI >> 1) * 8);
  if ((in_ESI & 1) == 0) {
    local_8 = Prog::Inst::out(this);
  }
  else {
    local_8 = Prog::Inst::out1(this);
  }
  return (PatchList)local_8;
}

Assistant:

PatchList PatchList::Deref(Prog::Inst* inst0, PatchList l) {
  Prog::Inst* ip = &inst0[l.p>>1];
  if (l.p&1)
    l.p = ip->out1();
  else
    l.p = ip->out();
  return l;
}